

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minmax_test.cc
# Opt level: O2

void __thiscall
(anonymous_namespace)::MinMaxTest_CompareReferenceAndVaryStride_Test::
~MinMaxTest_CompareReferenceAndVaryStride_Test(MinMaxTest_CompareReferenceAndVaryStride_Test *this)

{
  anon_unknown.dwarf_1afbd7e::MinMaxTest_CompareReferenceAndVaryStride_Test::
  ~MinMaxTest_CompareReferenceAndVaryStride_Test
            ((MinMaxTest_CompareReferenceAndVaryStride_Test *)(this + -0x10));
  return;
}

Assistant:

TEST_P(MinMaxTest, CompareReferenceAndVaryStride) {
  uint8_t a[8 * 64], b[8 * 64];
  for (int i = 0; i < 8 * 64; i++) {
    a[i] = rnd_.Rand8();
    b[i] = rnd_.Rand8();
  }
  for (int a_stride = 8; a_stride <= 64; a_stride += 8) {
    for (int b_stride = 8; b_stride <= 64; b_stride += 8) {
      int min_ref, max_ref, min, max;
      reference_minmax(a, a_stride, b, b_stride, &min_ref, &max_ref);
      API_REGISTER_STATE_CHECK(mm_func_(a, a_stride, b, b_stride, &min, &max));
      EXPECT_EQ(max_ref, max)
          << "when a_stride = " << a_stride << " and b_stride = " << b_stride;
      EXPECT_EQ(min_ref, min)
          << "when a_stride = " << a_stride << " and b_stride = " << b_stride;
    }
  }
}